

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_DrawRemainingPlayerSprites(void)

{
  float fVar1;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  undefined1 *puVar9;
  FTexture *img;
  DFrameBuffer *this;
  uint uVar10;
  int iVar11;
  FRemapTable *pFVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  FColormapStyle *local_90;
  FSpecialColormap *local_88;
  FColormapStyle colormapstyle;
  
  if (vispspindex != 0) {
    lVar15 = 0x10;
    uVar16 = 0;
    do {
      this = screen;
      lVar7 = *(long *)(vispsprites + -0x10 + lVar15);
      plVar8 = *(long **)(vispsprites + -8 + lVar15);
      puVar9 = *(undefined1 **)(lVar7 + 0xa0);
      if ((puVar9 < (SpecialColormaps.Array)->Colormap) ||
         (SpecialColormaps.Array[SpecialColormaps.Count].Colormap <= puVar9)) {
        if (*(anon_union_4_2_12391d7c_for_PalEntry_0 *)
             &((anon_union_4_2_12391d7c_for_PalEntry_0 *)(plVar8 + 1))->field_0 ==
            (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0xffffff &&
            (int)plVar8[2] == 0) {
          lVar14 = ((long)puVar9 - *plVar8 & 0xffffffffffffff00U) - ((long)puVar9 - *plVar8 >> 8);
          uVar10 = (uint)lVar14;
          uVar17 = uVar10 + 0x1f;
          if (-1 < lVar14) {
            uVar17 = uVar10;
          }
          uVar17 = (uVar17 & 0xffffffe0) << 0x13;
          uVar10 = *(uint *)((long)plVar8 + 0xc) & 0xffffff;
          local_90 = (FColormapStyle *)0x0;
        }
        else {
          colormapstyle.Fade.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                &((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)plVar8 + 0xc))->field_0;
          colormapstyle.FadeLevel = (float)((long)puVar9 - *plVar8 >> 8) * 0.03125;
          uVar17 = 0;
          uVar10 = 0;
          local_90 = &colormapstyle;
          colormapstyle.Color.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                &((anon_union_4_2_12391d7c_for_PalEntry_0 *)(plVar8 + 1))->field_0;
          colormapstyle.Desaturate = (int)plVar8[2];
        }
        local_88 = (FSpecialColormap *)0x0;
      }
      else {
        local_88 = SpecialColormaps.Array +
                   (ulong)((long)puVar9 - (long)(SpecialColormaps.Array)->Colormap) / 0x518;
        uVar17 = 0;
        uVar10 = 0;
        local_90 = (FColormapStyle *)0x0;
      }
      uVar5 = *(uint *)(lVar7 + 0x5c);
      iVar11 = *(int *)(vispsprites + lVar15) + viewwindowx;
      iVar13 = viewheight / 2 + viewwindowy;
      img = *(FTexture **)(lVar7 + 0x48);
      fVar1 = *(float *)(lVar7 + 0x24);
      dVar2 = *(double *)(lVar7 + 0x50);
      uVar3 = img->Width;
      iVar6 = *(int *)(lVar7 + 0x20);
      uVar4 = img->Height;
      pFVar12 = TranslationToTable(*(int *)(lVar7 + 0x98));
      DCanvas::DrawTexture
                ((DCanvas *)this,img,(double)iVar11,((double)iVar13 + -0.5) - (double)fVar1 * dVar2,
                 0x400013af,(double)(int)((uint)uVar3 * iVar6) * 1.52587890625e-05,
                 (double)((float)uVar4 * fVar1),(double)*(float *)(lVar7 + 0xa8),0x400013b0,
                 0x4000138e,pFVar12,0x40001395,uVar5 >> 0x1f,0x4000139b,0,0x4000139c,0,0x400013a3,
                 (ulong)(uint)viewwindowx,0x400013a1,(ulong)(uint)viewwindowy,0x400013a4,
                 (ulong)(uint)(viewwidth + viewwindowx),0x400013a2,
                 (ulong)(uint)(viewheight + viewwindowy),0x4000138c,0x400013a9,
                 (ulong)*(uint *)(lVar7 + 0xac),0x4000138d,(ulong)*(uint *)(lVar7 + 0x38),0x400013ac
                 ,local_88,0x400013aa,(ulong)(uVar17 | uVar10),0x400013ad,local_90,0);
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x18;
    } while (uVar16 < vispspindex);
  }
  vispspindex = 0;
  return;
}

Assistant:

void R_DrawRemainingPlayerSprites()
{
	for (unsigned int i = 0; i < vispspindex; i++)
	{
		vissprite_t *vis;
		
		vis = vispsprites[i].vis;
		FDynamicColormap *colormap = vispsprites[i].basecolormap;
		bool flip = vis->xiscale < 0;
		FSpecialColormap *special = NULL;
		PalEntry overlay = 0;
		FColormapStyle colormapstyle;
		bool usecolormapstyle = false;

		if (vis->Style.colormap >= SpecialColormaps[0].Colormap && 
			vis->Style.colormap < SpecialColormaps[SpecialColormaps.Size()].Colormap)
		{
			// Yuck! There needs to be a better way to store colormaps in the vissprite... :(
			ptrdiff_t specialmap = (vis->Style.colormap - SpecialColormaps[0].Colormap) / sizeof(FSpecialColormap);
			special = &SpecialColormaps[specialmap];
		}
		else if (colormap->Color == PalEntry(255,255,255) &&
			colormap->Desaturate == 0)
		{
			overlay = colormap->Fade;
			overlay.a = BYTE(((vis->Style.colormap - colormap->Maps) >> 8) * 255 / NUMCOLORMAPS);
		}
		else
		{
			usecolormapstyle = true;
			colormapstyle.Color = colormap->Color;
			colormapstyle.Fade = colormap->Fade;
			colormapstyle.Desaturate = colormap->Desaturate;
			colormapstyle.FadeLevel = ((vis->Style.colormap - colormap->Maps) >> 8) / float(NUMCOLORMAPS);
		}
		screen->DrawTexture(vis->pic,
			viewwindowx + vispsprites[i].x1,
			viewwindowy + viewheight/2 - vis->texturemid * vis->yscale - 0.5,
			DTA_DestWidthF, FIXED2DBL(vis->pic->GetWidth() * vis->xscale),
			DTA_DestHeightF, vis->pic->GetHeight() * vis->yscale,
			DTA_Translation, TranslationToTable(vis->Translation),
			DTA_FlipX, flip,
			DTA_TopOffset, 0,
			DTA_LeftOffset, 0,
			DTA_ClipLeft, viewwindowx,
			DTA_ClipTop, viewwindowy,
			DTA_ClipRight, viewwindowx + viewwidth,
			DTA_ClipBottom, viewwindowy + viewheight,
			DTA_AlphaF, vis->Style.Alpha,
			DTA_RenderStyle, vis->Style.RenderStyle,
			DTA_FillColor, vis->FillColor,
			DTA_SpecialColormap, special,
			DTA_ColorOverlay, overlay.d,
			DTA_ColormapStyle, usecolormapstyle ? &colormapstyle : NULL,
			TAG_DONE);
	}

	vispspindex = 0;
}